

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

QNetworkProxy __thiscall QGlobalNetworkProxy::applicationProxy(QGlobalNetworkProxy *this)

{
  long lVar1;
  QSharedDataPointer<QNetworkProxyPrivate> in_RDI;
  long in_FS_OFFSET;
  QNetworkProxy *in_stack_ffffffffffffff98;
  QNetworkProxyQuery *in_stack_ffffffffffffffd8;
  QGlobalNetworkProxy *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QNetworkProxyQuery::QNetworkProxyQuery((QNetworkProxyQuery *)0x24d4f6);
  proxyForQuery(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  QList<QNetworkProxy>::constFirst((QList<QNetworkProxy> *)in_RDI.d.ptr);
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)in_RDI.d.ptr,in_stack_ffffffffffffff98);
  QList<QNetworkProxy>::~QList((QList<QNetworkProxy> *)0x24d530);
  QNetworkProxyQuery::~QNetworkProxyQuery((QNetworkProxyQuery *)0x24d53a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSharedDataPointer<QNetworkProxyPrivate>)
           (QSharedDataPointer<QNetworkProxyPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkProxy applicationProxy()
    {
        return proxyForQuery(QNetworkProxyQuery()).constFirst();
    }